

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void anon_unknown.dwarf_ff84f::AddErrorInfoWithLocation
               (ExpressionContext *ctx,SmallArray<ErrorInfo_*,_4U> *errorList,SynBase *source,
               char *messageStart,char *messageEnd)

{
  Allocator *pAVar1;
  char *__s;
  Lexeme *pLVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  size_t sVar5;
  ModuleData *pMVar6;
  ErrorInfo **ppEVar7;
  ErrorInfo *local_30;
  
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  local_30 = (ErrorInfo *)CONCAT44(extraout_var,iVar3);
  pAVar1 = ctx->allocator;
  pcVar4 = (source->pos).begin;
  local_30->messageStart = messageStart;
  local_30->messageEnd = messageEnd;
  pLVar2 = source->end;
  local_30->begin = source->begin;
  local_30->end = pLVar2;
  local_30->pos = pcVar4;
  (local_30->related).allocator = pAVar1;
  (local_30->related).data = (local_30->related).little;
  (local_30->related).count = 0;
  (local_30->related).max = 4;
  local_30->parentModule = (ModuleData *)0x0;
  SmallArray<ErrorInfo_*,_4U>::push_back(errorList,&local_30);
  pcVar4 = FindModuleCodeWithSourceLocation(ctx,(source->pos).begin);
  if (pcVar4 != (char *)0x0) {
    AddErrorLocationInfo(pcVar4,(source->pos).begin,ctx->errorBuf,ctx->errorBufSize);
    __s = ctx->errorBufLocation;
    sVar5 = strlen(__s);
    ctx->errorBufLocation = __s + sVar5;
    if (pcVar4 != ctx->code) {
      pMVar6 = FindModuleWithSourceLocation(ctx,(source->pos).begin);
      if (pMVar6 != (ModuleData *)0x0) {
        NULLC::SafeSprintf(ctx->errorBufLocation,
                           (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                                  ctx->errorBufSize)," [in module \'%.*s\']\n",
                           (ulong)(uint)(*(int *)&(pMVar6->name).end - (int)(pMVar6->name).begin));
        pcVar4 = ctx->errorBufLocation;
        sVar5 = strlen(pcVar4);
        ctx->errorBufLocation = pcVar4 + sVar5;
        ppEVar7 = SmallArray<ErrorInfo_*,_4U>::back(errorList);
        (*ppEVar7)->parentModule = pMVar6;
      }
    }
  }
  return;
}

Assistant:

void AddErrorInfoWithLocation(ExpressionContext &ctx, SmallArray<ErrorInfo*, 4> &errorList, SynBase *source, const char *messageStart, const char *messageEnd)
	{
		errorList.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, source->pos.begin));

		if(const char *code = FindModuleCodeWithSourceLocation(ctx, source->pos.begin))
		{
			AddErrorLocationInfo(code, source->pos.begin, ctx.errorBuf, ctx.errorBufSize);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			if(code != ctx.code)
			{
				ModuleData *parentModule = FindModuleWithSourceLocation(ctx, source->pos.begin);

				if(parentModule)
				{
					NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), " [in module '%.*s']\n", FMT_ISTR(parentModule->name));

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);

					errorList.back()->parentModule = parentModule;
				}
			}
		}
	}